

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# media.cpp
# Opt level: O0

bool pbrt::GetMediumScatteringProperties
               (string *name,Spectrum *sigma_a,Spectrum *sigma_s,Allocator alloc)

{
  bool bVar1;
  int iVar2;
  MeasuredSS *mss;
  MeasuredSS *__end1;
  MeasuredSS *__begin1;
  MeasuredSS (*__range1) [47];
  RGBUnboundedSpectrum *in_stack_ffffffffffffff98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa0;
  RGBColorSpace *args;
  RGBColorSpace *this;
  RGBColorSpace *local_48;
  
  if ((GetMediumScatteringProperties(std::__cxx11::string_const&,pbrt::Spectrum*,pbrt::Spectrum*,pstd::pmr::polymorphic_allocator<std::byte>)
       ::SubsurfaceParameterTable == '\0') &&
     (iVar2 = __cxa_guard_acquire(&GetMediumScatteringProperties(std::__cxx11::string_const&,pbrt::Spectrum*,pbrt::Spectrum*,pstd::pmr::polymorphic_allocator<std::byte>)
                                   ::SubsurfaceParameterTable), iVar2 != 0)) {
    GetMediumScatteringProperties::SubsurfaceParameterTable[0].name = "Apple";
    RGB::RGB(&GetMediumScatteringProperties::SubsurfaceParameterTable[0].sigma_prime_s,2.29,2.39,
             1.97);
    RGB::RGB(&GetMediumScatteringProperties::SubsurfaceParameterTable[0].sigma_a,0.003,0.0034,0.046)
    ;
    GetMediumScatteringProperties::SubsurfaceParameterTable[1].name = "Chicken1";
    RGB::RGB(&GetMediumScatteringProperties::SubsurfaceParameterTable[1].sigma_prime_s,0.15,0.21,
             0.38);
    RGB::RGB(&GetMediumScatteringProperties::SubsurfaceParameterTable[1].sigma_a,0.015,0.077,0.19);
    GetMediumScatteringProperties::SubsurfaceParameterTable[2].name = "Chicken2";
    RGB::RGB(&GetMediumScatteringProperties::SubsurfaceParameterTable[2].sigma_prime_s,0.19,0.25,
             0.32);
    RGB::RGB(&GetMediumScatteringProperties::SubsurfaceParameterTable[2].sigma_a,0.018,0.088,0.2);
    GetMediumScatteringProperties::SubsurfaceParameterTable[3].name = "Cream";
    RGB::RGB(&GetMediumScatteringProperties::SubsurfaceParameterTable[3].sigma_prime_s,7.38,5.47,
             3.15);
    RGB::RGB(&GetMediumScatteringProperties::SubsurfaceParameterTable[3].sigma_a,0.0002,0.0028,
             0.0163);
    GetMediumScatteringProperties::SubsurfaceParameterTable[4].name = "Ketchup";
    RGB::RGB(&GetMediumScatteringProperties::SubsurfaceParameterTable[4].sigma_prime_s,0.18,0.07,
             0.03);
    RGB::RGB(&GetMediumScatteringProperties::SubsurfaceParameterTable[4].sigma_a,0.061,0.97,1.45);
    GetMediumScatteringProperties::SubsurfaceParameterTable[5].name = "Marble";
    RGB::RGB(&GetMediumScatteringProperties::SubsurfaceParameterTable[5].sigma_prime_s,2.19,2.62,3.0
            );
    RGB::RGB(&GetMediumScatteringProperties::SubsurfaceParameterTable[5].sigma_a,0.0021,0.0041,
             0.0071);
    GetMediumScatteringProperties::SubsurfaceParameterTable[6].name = "Potato";
    RGB::RGB(&GetMediumScatteringProperties::SubsurfaceParameterTable[6].sigma_prime_s,0.68,0.7,0.55
            );
    RGB::RGB(&GetMediumScatteringProperties::SubsurfaceParameterTable[6].sigma_a,0.0024,0.009,0.12);
    GetMediumScatteringProperties::SubsurfaceParameterTable[7].name = "Skimmilk";
    RGB::RGB(&GetMediumScatteringProperties::SubsurfaceParameterTable[7].sigma_prime_s,0.7,1.22,1.9)
    ;
    RGB::RGB(&GetMediumScatteringProperties::SubsurfaceParameterTable[7].sigma_a,0.0014,0.0025,
             0.0142);
    GetMediumScatteringProperties::SubsurfaceParameterTable[8].name = "Skin1";
    RGB::RGB(&GetMediumScatteringProperties::SubsurfaceParameterTable[8].sigma_prime_s,0.74,0.88,
             1.01);
    RGB::RGB(&GetMediumScatteringProperties::SubsurfaceParameterTable[8].sigma_a,0.032,0.17,0.48);
    GetMediumScatteringProperties::SubsurfaceParameterTable[9].name = "Skin2";
    RGB::RGB(&GetMediumScatteringProperties::SubsurfaceParameterTable[9].sigma_prime_s,1.09,1.59,
             1.79);
    RGB::RGB(&GetMediumScatteringProperties::SubsurfaceParameterTable[9].sigma_a,0.013,0.07,0.145);
    GetMediumScatteringProperties::SubsurfaceParameterTable[10].name = "Spectralon";
    RGB::RGB(&GetMediumScatteringProperties::SubsurfaceParameterTable[10].sigma_prime_s,11.6,20.4,
             14.9);
    RGB::RGB(&GetMediumScatteringProperties::SubsurfaceParameterTable[10].sigma_a,0.0,0.0,0.0);
    GetMediumScatteringProperties::SubsurfaceParameterTable[0xb].name = "Wholemilk";
    RGB::RGB(&GetMediumScatteringProperties::SubsurfaceParameterTable[0xb].sigma_prime_s,2.55,3.21,
             3.77);
    RGB::RGB(&GetMediumScatteringProperties::SubsurfaceParameterTable[0xb].sigma_a,0.0011,0.0024,
             0.014);
    GetMediumScatteringProperties::SubsurfaceParameterTable[0xc].name = "Lowfat Milk";
    RGB::RGB(&GetMediumScatteringProperties::SubsurfaceParameterTable[0xc].sigma_prime_s,0.89187,
             1.5136,2.532);
    RGB::RGB(&GetMediumScatteringProperties::SubsurfaceParameterTable[0xc].sigma_a,0.002875,0.00575,
             0.0115);
    GetMediumScatteringProperties::SubsurfaceParameterTable[0xd].name = "Reduced Milk";
    RGB::RGB(&GetMediumScatteringProperties::SubsurfaceParameterTable[0xd].sigma_prime_s,2.4858,
             3.1669,4.5214);
    RGB::RGB(&GetMediumScatteringProperties::SubsurfaceParameterTable[0xd].sigma_a,0.0025556,
             0.0051111,0.012778);
    GetMediumScatteringProperties::SubsurfaceParameterTable[0xe].name = "Regular Milk";
    RGB::RGB(&GetMediumScatteringProperties::SubsurfaceParameterTable[0xe].sigma_prime_s,4.5513,
             5.8294,7.136);
    RGB::RGB(&GetMediumScatteringProperties::SubsurfaceParameterTable[0xe].sigma_a,0.0015333,0.0046,
             0.019933);
    GetMediumScatteringProperties::SubsurfaceParameterTable[0xf].name = "Espresso";
    RGB::RGB(&GetMediumScatteringProperties::SubsurfaceParameterTable[0xf].sigma_prime_s,0.72378,
             0.84557,1.0247);
    RGB::RGB(&GetMediumScatteringProperties::SubsurfaceParameterTable[0xf].sigma_a,4.7984,6.5751,
             8.8493);
    GetMediumScatteringProperties::SubsurfaceParameterTable[0x10].name = "Mint Mocha Coffee";
    RGB::RGB(&GetMediumScatteringProperties::SubsurfaceParameterTable[0x10].sigma_prime_s,0.31602,
             0.38538,0.48131);
    RGB::RGB(&GetMediumScatteringProperties::SubsurfaceParameterTable[0x10].sigma_a,3.772,5.8228,
             7.82);
    GetMediumScatteringProperties::SubsurfaceParameterTable[0x11].name = "Lowfat Soy Milk";
    RGB::RGB(&GetMediumScatteringProperties::SubsurfaceParameterTable[0x11].sigma_prime_s,0.30576,
             0.34233,0.61664);
    RGB::RGB(&GetMediumScatteringProperties::SubsurfaceParameterTable[0x11].sigma_a,0.0014375,
             0.0071875,0.035937);
    GetMediumScatteringProperties::SubsurfaceParameterTable[0x12].name = "Regular Soy Milk";
    RGB::RGB(&GetMediumScatteringProperties::SubsurfaceParameterTable[0x12].sigma_prime_s,0.59223,
             0.73866,1.4693);
    RGB::RGB(&GetMediumScatteringProperties::SubsurfaceParameterTable[0x12].sigma_a,0.0019167,
             0.0095833,0.065167);
    GetMediumScatteringProperties::SubsurfaceParameterTable[0x13].name = "Lowfat Chocolate Milk";
    RGB::RGB(&GetMediumScatteringProperties::SubsurfaceParameterTable[0x13].sigma_prime_s,0.64925,
             0.83916,1.1057);
    RGB::RGB(&GetMediumScatteringProperties::SubsurfaceParameterTable[0x13].sigma_a,0.0115,0.0368,
             0.1564);
    GetMediumScatteringProperties::SubsurfaceParameterTable[0x14].name = "Regular Chocolate Milk";
    RGB::RGB(&GetMediumScatteringProperties::SubsurfaceParameterTable[0x14].sigma_prime_s,1.4585,
             2.1289,2.9527);
    RGB::RGB(&GetMediumScatteringProperties::SubsurfaceParameterTable[0x14].sigma_a,0.010063,
             0.043125,0.14375);
    GetMediumScatteringProperties::SubsurfaceParameterTable[0x15].name = "Coke";
    RGB::RGB(&GetMediumScatteringProperties::SubsurfaceParameterTable[0x15].sigma_prime_s,8.9053e-05
             ,8.372e-05,0.0);
    RGB::RGB(&GetMediumScatteringProperties::SubsurfaceParameterTable[0x15].sigma_a,0.10014,0.16503,
             0.2468);
    GetMediumScatteringProperties::SubsurfaceParameterTable[0x16].name = "Pepsi";
    RGB::RGB(&GetMediumScatteringProperties::SubsurfaceParameterTable[0x16].sigma_prime_s,6.1697e-05
             ,4.2564e-05,0.0);
    RGB::RGB(&GetMediumScatteringProperties::SubsurfaceParameterTable[0x16].sigma_a,0.091641,0.14158
             ,0.20729);
    GetMediumScatteringProperties::SubsurfaceParameterTable[0x17].name = "Sprite";
    RGB::RGB(&GetMediumScatteringProperties::SubsurfaceParameterTable[0x17].sigma_prime_s,6.0306e-06
             ,6.4139e-06,6.5504e-06);
    RGB::RGB(&GetMediumScatteringProperties::SubsurfaceParameterTable[0x17].sigma_a,0.001886,
             0.0018308,0.0020025);
    GetMediumScatteringProperties::SubsurfaceParameterTable[0x18].name = "Gatorade";
    RGB::RGB(&GetMediumScatteringProperties::SubsurfaceParameterTable[0x18].sigma_prime_s,0.0024574,
             0.003007,0.0037325);
    RGB::RGB(&GetMediumScatteringProperties::SubsurfaceParameterTable[0x18].sigma_a,0.024794,
             0.019289,0.008878);
    GetMediumScatteringProperties::SubsurfaceParameterTable[0x19].name = "Chardonnay";
    RGB::RGB(&GetMediumScatteringProperties::SubsurfaceParameterTable[0x19].sigma_prime_s,1.7982e-05
             ,1.3758e-05,1.2023e-05);
    RGB::RGB(&GetMediumScatteringProperties::SubsurfaceParameterTable[0x19].sigma_a,0.010782,
             0.011855,0.023997);
    GetMediumScatteringProperties::SubsurfaceParameterTable[0x1a].name = "White Zinfandel";
    RGB::RGB(&GetMediumScatteringProperties::SubsurfaceParameterTable[0x1a].sigma_prime_s,1.7501e-05
             ,1.9069e-05,1.288e-05);
    RGB::RGB(&GetMediumScatteringProperties::SubsurfaceParameterTable[0x1a].sigma_a,0.012072,
             0.016184,0.019843);
    GetMediumScatteringProperties::SubsurfaceParameterTable[0x1b].name = "Merlot";
    RGB::RGB(&GetMediumScatteringProperties::SubsurfaceParameterTable[0x1b].sigma_prime_s,2.1129e-05
             ,0.0,0.0);
    RGB::RGB(&GetMediumScatteringProperties::SubsurfaceParameterTable[0x1b].sigma_a,0.11632,0.25191,
             0.29434);
    GetMediumScatteringProperties::SubsurfaceParameterTable[0x1c].name = "Budweiser Beer";
    RGB::RGB(&GetMediumScatteringProperties::SubsurfaceParameterTable[0x1c].sigma_prime_s,2.4356e-05
             ,2.4079e-05,1.0564e-05);
    RGB::RGB(&GetMediumScatteringProperties::SubsurfaceParameterTable[0x1c].sigma_a,0.011492,
             0.024911,0.057786);
    GetMediumScatteringProperties::SubsurfaceParameterTable[0x1d].name = "Coors Light Beer";
    RGB::RGB(&GetMediumScatteringProperties::SubsurfaceParameterTable[0x1d].sigma_prime_s,5.0922e-05
             ,4.301e-05,0.0);
    RGB::RGB(&GetMediumScatteringProperties::SubsurfaceParameterTable[0x1d].sigma_a,0.006164,
             0.013984,0.034983);
    GetMediumScatteringProperties::SubsurfaceParameterTable[0x1e].name = "Clorox";
    RGB::RGB(&GetMediumScatteringProperties::SubsurfaceParameterTable[0x1e].sigma_prime_s,0.0024035,
             0.0031373,0.003991);
    RGB::RGB(&GetMediumScatteringProperties::SubsurfaceParameterTable[0x1e].sigma_a,0.0033542,
             0.014892,0.026297);
    GetMediumScatteringProperties::SubsurfaceParameterTable[0x1f].name = "Apple Juice";
    RGB::RGB(&GetMediumScatteringProperties::SubsurfaceParameterTable[0x1f].sigma_prime_s,0.00013612
             ,0.00015836,0.000227);
    RGB::RGB(&GetMediumScatteringProperties::SubsurfaceParameterTable[0x1f].sigma_a,0.012957,
             0.023741,0.052184);
    GetMediumScatteringProperties::SubsurfaceParameterTable[0x20].name = "Cranberry Juice";
    RGB::RGB(&GetMediumScatteringProperties::SubsurfaceParameterTable[0x20].sigma_prime_s,0.00010402
             ,0.00011646,7.8139e-05);
    RGB::RGB(&GetMediumScatteringProperties::SubsurfaceParameterTable[0x20].sigma_a,0.039437,
             0.094223,0.12426);
    GetMediumScatteringProperties::SubsurfaceParameterTable[0x21].name = "Grape Juice";
    RGB::RGB(&GetMediumScatteringProperties::SubsurfaceParameterTable[0x21].sigma_prime_s,5.382e-05,
             0.0,0.0);
    RGB::RGB(&GetMediumScatteringProperties::SubsurfaceParameterTable[0x21].sigma_a,0.10404,0.23958,
             0.29325);
    GetMediumScatteringProperties::SubsurfaceParameterTable[0x22].name = "Ruby Grapefruit Juice";
    RGB::RGB(&GetMediumScatteringProperties::SubsurfaceParameterTable[0x22].sigma_prime_s,0.011002,
             0.010927,0.011036);
    RGB::RGB(&GetMediumScatteringProperties::SubsurfaceParameterTable[0x22].sigma_a,0.085867,0.18314
             ,0.25262);
    GetMediumScatteringProperties::SubsurfaceParameterTable[0x23].name = "White Grapefruit Juice";
    RGB::RGB(&GetMediumScatteringProperties::SubsurfaceParameterTable[0x23].sigma_prime_s,0.22826,
             0.23998,0.32748);
    RGB::RGB(&GetMediumScatteringProperties::SubsurfaceParameterTable[0x23].sigma_a,0.0138,0.018831,
             0.056781);
    GetMediumScatteringProperties::SubsurfaceParameterTable[0x24].name = "Shampoo";
    RGB::RGB(&GetMediumScatteringProperties::SubsurfaceParameterTable[0x24].sigma_prime_s,0.0007176,
             0.0008303,0.0009016);
    RGB::RGB(&GetMediumScatteringProperties::SubsurfaceParameterTable[0x24].sigma_a,0.014107,
             0.045693,0.061717);
    GetMediumScatteringProperties::SubsurfaceParameterTable[0x25].name = "Strawberry Shampoo";
    RGB::RGB(&GetMediumScatteringProperties::SubsurfaceParameterTable[0x25].sigma_prime_s,0.00015671
             ,0.00015947,1.518e-05);
    RGB::RGB(&GetMediumScatteringProperties::SubsurfaceParameterTable[0x25].sigma_a,0.01449,0.05796,
             0.075823);
    GetMediumScatteringProperties::SubsurfaceParameterTable[0x26].name = "Head & Shoulders Shampoo";
    RGB::RGB(&GetMediumScatteringProperties::SubsurfaceParameterTable[0x26].sigma_prime_s,0.023805,
             0.028804,0.034306);
    RGB::RGB(&GetMediumScatteringProperties::SubsurfaceParameterTable[0x26].sigma_a,0.084621,0.15688
             ,0.20365);
    GetMediumScatteringProperties::SubsurfaceParameterTable[0x27].name = "Lemon Tea Powder";
    RGB::RGB(&GetMediumScatteringProperties::SubsurfaceParameterTable[0x27].sigma_prime_s,0.040224,
             0.045264,0.051081);
    RGB::RGB(&GetMediumScatteringProperties::SubsurfaceParameterTable[0x27].sigma_a,2.4288,4.5757,
             7.2127);
    GetMediumScatteringProperties::SubsurfaceParameterTable[0x28].name = "Orange Powder";
    RGB::RGB(&GetMediumScatteringProperties::SubsurfaceParameterTable[0x28].sigma_prime_s,0.00015617
             ,0.00017482,0.0001762);
    RGB::RGB(&GetMediumScatteringProperties::SubsurfaceParameterTable[0x28].sigma_a,0.001449,
             0.003441,0.007863);
    GetMediumScatteringProperties::SubsurfaceParameterTable[0x29].name = "Pink Lemonade Powder";
    RGB::RGB(&GetMediumScatteringProperties::SubsurfaceParameterTable[0x29].sigma_prime_s,0.00012103
             ,0.00013073,0.00012528);
    RGB::RGB(&GetMediumScatteringProperties::SubsurfaceParameterTable[0x29].sigma_a,0.001165,
             0.002366,0.003195);
    GetMediumScatteringProperties::SubsurfaceParameterTable[0x2a].name = "Cappuccino Powder";
    RGB::RGB(&GetMediumScatteringProperties::SubsurfaceParameterTable[0x2a].sigma_prime_s,1.8436,
             2.5851,2.1662);
    RGB::RGB(&GetMediumScatteringProperties::SubsurfaceParameterTable[0x2a].sigma_a,35.844,49.547,
             61.084);
    GetMediumScatteringProperties::SubsurfaceParameterTable[0x2b].name = "Salt Powder";
    RGB::RGB(&GetMediumScatteringProperties::SubsurfaceParameterTable[0x2b].sigma_prime_s,0.027333,
             0.032451,0.031979);
    RGB::RGB(&GetMediumScatteringProperties::SubsurfaceParameterTable[0x2b].sigma_a,0.28415,0.3257,
             0.34148);
    GetMediumScatteringProperties::SubsurfaceParameterTable[0x2c].name = "Sugar Powder";
    RGB::RGB(&GetMediumScatteringProperties::SubsurfaceParameterTable[0x2c].sigma_prime_s,0.00022272
             ,0.00025513,0.000271);
    RGB::RGB(&GetMediumScatteringProperties::SubsurfaceParameterTable[0x2c].sigma_a,0.012638,
             0.031051,0.050124);
    GetMediumScatteringProperties::SubsurfaceParameterTable[0x2d].name = "Suisse Mocha Powder";
    RGB::RGB(&GetMediumScatteringProperties::SubsurfaceParameterTable[0x2d].sigma_prime_s,2.7979,
             3.5452,4.3365);
    RGB::RGB(&GetMediumScatteringProperties::SubsurfaceParameterTable[0x2d].sigma_a,17.502,27.004,
             35.433);
    GetMediumScatteringProperties::SubsurfaceParameterTable[0x2e].name =
         "Pacific Ocean Surface Water";
    RGB::RGB(&GetMediumScatteringProperties::SubsurfaceParameterTable[0x2e].sigma_prime_s,0.0001764,
             0.00032095,0.00019617);
    RGB::RGB(&GetMediumScatteringProperties::SubsurfaceParameterTable[0x2e].sigma_a,0.031845,
             0.031324,0.030147);
    __cxa_guard_release(&GetMediumScatteringProperties(std::__cxx11::string_const&,pbrt::Spectrum*,pbrt::Spectrum*,pstd::pmr::polymorphic_allocator<std::byte>)
                         ::SubsurfaceParameterTable);
  }
  local_48 = (RGBColorSpace *)GetMediumScatteringProperties::SubsurfaceParameterTable;
  this = (RGBColorSpace *)
         &GetMediumScatteringProperties(std::__cxx11::string_const&,pbrt::Spectrum*,pbrt::Spectrum*,pstd::pmr::polymorphic_allocator<std::byte>)
          ::SubsurfaceParameterTable;
  while( true ) {
    if (local_48 == this) {
      return false;
    }
    args = local_48;
    bVar1 = std::operator==(in_stack_ffffffffffffffa0,(char *)in_stack_ffffffffffffff98);
    if (bVar1) break;
    local_48 = (RGBColorSpace *)&local_48->illuminant;
  }
  pstd::pmr::polymorphic_allocator<std::byte>::
  new_object<pbrt::RGBUnboundedSpectrum,pbrt::RGBColorSpace_const&,pbrt::RGB&>
            ((polymorphic_allocator<std::byte> *)this,args,(RGB *)in_stack_ffffffffffffffa0);
  Spectrum::TaggedPointer<pbrt::RGBUnboundedSpectrum>
            ((Spectrum *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  Spectrum::operator=((Spectrum *)in_stack_ffffffffffffffa0,(Spectrum *)in_stack_ffffffffffffff98);
  pstd::pmr::polymorphic_allocator<std::byte>::
  new_object<pbrt::RGBUnboundedSpectrum,pbrt::RGBColorSpace_const&,pbrt::RGB&>
            ((polymorphic_allocator<std::byte> *)this,args,(RGB *)in_stack_ffffffffffffffa0);
  Spectrum::TaggedPointer<pbrt::RGBUnboundedSpectrum>
            ((Spectrum *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  Spectrum::operator=((Spectrum *)in_stack_ffffffffffffffa0,(Spectrum *)in_stack_ffffffffffffff98);
  return true;
}

Assistant:

bool GetMediumScatteringProperties(const std::string &name, Spectrum *sigma_a,
                                   Spectrum *sigma_s, Allocator alloc) {
    static MeasuredSS SubsurfaceParameterTable[] = {
        // From "A Practical Model for Subsurface Light Transport"
        // Jensen, Marschner, Levoy, Hanrahan
        // Proc SIGGRAPH 2001
        // clang-format off
        {"Apple", RGB(2.29, 2.39, 1.97), RGB(0.0030, 0.0034, 0.046)},
        {"Chicken1", RGB(0.15, 0.21, 0.38), RGB(0.015, 0.077, 0.19)},
        {"Chicken2", RGB(0.19, 0.25, 0.32), RGB(0.018, 0.088, 0.20)},
        {"Cream", RGB(7.38, 5.47, 3.15), RGB(0.0002, 0.0028, 0.0163)},
        {"Ketchup", RGB(0.18, 0.07, 0.03), RGB(0.061, 0.97, 1.45)},
        {"Marble", RGB(2.19, 2.62, 3.00), RGB(0.0021, 0.0041, 0.0071)},
        {"Potato", RGB(0.68, 0.70, 0.55), RGB(0.0024, 0.0090, 0.12)},
        {"Skimmilk", RGB(0.70, 1.22, 1.90), RGB(0.0014, 0.0025, 0.0142)},
        {"Skin1", RGB(0.74, 0.88, 1.01), RGB(0.032, 0.17, 0.48)},
        {"Skin2", RGB(1.09, 1.59, 1.79), RGB(0.013, 0.070, 0.145)},
        {"Spectralon", RGB(11.6, 20.4, 14.9), RGB(0.00, 0.00, 0.00)},
        {"Wholemilk", RGB(2.55, 3.21, 3.77), RGB(0.0011, 0.0024, 0.014)},

        // From "Acquiring Scattering Properties of Participating Media by
        // Dilution",
        // Narasimhan, Gupta, Donner, Ramamoorthi, Nayar, Jensen
        // Proc SIGGRAPH 2006
        {"Lowfat Milk", RGB(0.89187, 1.5136, 2.532), RGB(0.002875, 0.00575, 0.0115)},
        {"Reduced Milk", RGB(2.4858, 3.1669, 4.5214), RGB(0.0025556, 0.0051111, 0.012778)},
        {"Regular Milk", RGB(4.5513, 5.8294, 7.136), RGB(0.0015333, 0.0046, 0.019933)},
        {"Espresso", RGB(0.72378, 0.84557, 1.0247), RGB(4.7984, 6.5751, 8.8493)},
        {"Mint Mocha Coffee", RGB(0.31602, 0.38538, 0.48131), RGB(3.772, 5.8228, 7.82)},
        {"Lowfat Soy Milk", RGB(0.30576, 0.34233, 0.61664), RGB(0.0014375, 0.0071875, 0.035937)},
        {"Regular Soy Milk", RGB(0.59223, 0.73866, 1.4693), RGB(0.0019167, 0.0095833, 0.065167)},
        {"Lowfat Chocolate Milk", RGB(0.64925, 0.83916, 1.1057), RGB(0.0115, 0.0368, 0.1564)},
        {"Regular Chocolate Milk", RGB(1.4585, 2.1289, 2.9527), RGB(0.010063, 0.043125, 0.14375)},
        {"Coke", RGB(8.9053e-05, 8.372e-05, 0), RGB(0.10014, 0.16503, 0.2468)},
        {"Pepsi", RGB(6.1697e-05, 4.2564e-05, 0), RGB(0.091641, 0.14158, 0.20729)},
        {"Sprite", RGB(6.0306e-06, 6.4139e-06, 6.5504e-06), RGB(0.001886, 0.0018308, 0.0020025)},
        {"Gatorade", RGB(0.0024574, 0.003007, 0.0037325), RGB(0.024794, 0.019289, 0.008878)},
        {"Chardonnay", RGB(1.7982e-05, 1.3758e-05, 1.2023e-05), RGB(0.010782, 0.011855, 0.023997)},
        {"White Zinfandel", RGB(1.7501e-05, 1.9069e-05, 1.288e-05), RGB(0.012072, 0.016184, 0.019843)},
        {"Merlot", RGB(2.1129e-05, 0, 0), RGB(0.11632, 0.25191, 0.29434)},
        {"Budweiser Beer", RGB(2.4356e-05, 2.4079e-05, 1.0564e-05), RGB(0.011492, 0.024911, 0.057786)},
        {"Coors Light Beer", RGB(5.0922e-05, 4.301e-05, 0), RGB(0.006164, 0.013984, 0.034983)},
        {"Clorox", RGB(0.0024035, 0.0031373, 0.003991), RGB(0.0033542, 0.014892, 0.026297)},
        {"Apple Juice", RGB(0.00013612, 0.00015836, 0.000227), RGB(0.012957, 0.023741, 0.052184)},
        {"Cranberry Juice", RGB(0.00010402, 0.00011646, 7.8139e-05), RGB(0.039437, 0.094223, 0.12426)},
        {"Grape Juice", RGB(5.382e-05, 0, 0), RGB(0.10404, 0.23958, 0.29325)},
        {"Ruby Grapefruit Juice", RGB(0.011002, 0.010927, 0.011036), RGB(0.085867, 0.18314, 0.25262)},
        {"White Grapefruit Juice", RGB(0.22826, 0.23998, 0.32748), RGB(0.0138, 0.018831, 0.056781)},
        {"Shampoo", RGB(0.0007176, 0.0008303, 0.0009016), RGB(0.014107, 0.045693, 0.061717)},
        {"Strawberry Shampoo", RGB(0.00015671, 0.00015947, 1.518e-05), RGB(0.01449, 0.05796, 0.075823)},
        {"Head & Shoulders Shampoo", RGB(0.023805, 0.028804, 0.034306), RGB(0.084621, 0.15688, 0.20365)},
        {"Lemon Tea Powder", RGB(0.040224, 0.045264, 0.051081), RGB(2.4288, 4.5757, 7.2127)},
        {"Orange Powder", RGB(0.00015617, 0.00017482, 0.0001762), RGB(0.001449, 0.003441, 0.007863)},
        {"Pink Lemonade Powder", RGB(0.00012103, 0.00013073, 0.00012528), RGB(0.001165, 0.002366, 0.003195)},
        {"Cappuccino Powder", RGB(1.8436, 2.5851, 2.1662), RGB(35.844, 49.547, 61.084)},
        {"Salt Powder", RGB(0.027333, 0.032451, 0.031979), RGB(0.28415, 0.3257, 0.34148)},
        {"Sugar Powder", RGB(0.00022272, 0.00025513, 0.000271), RGB(0.012638, 0.031051, 0.050124)},
        {"Suisse Mocha Powder", RGB(2.7979, 3.5452, 4.3365), RGB(17.502, 27.004, 35.433)},
        {"Pacific Ocean Surface Water", RGB(0.0001764, 0.00032095, 0.00019617), RGB(0.031845, 0.031324, 0.030147)}
        // clang-format on
    };

    for (MeasuredSS &mss : SubsurfaceParameterTable) {
        if (name == mss.name) {
            *sigma_a =
                alloc.new_object<RGBUnboundedSpectrum>(*RGBColorSpace::sRGB, mss.sigma_a);
            *sigma_s = alloc.new_object<RGBUnboundedSpectrum>(*RGBColorSpace::sRGB,
                                                              mss.sigma_prime_s);
            return true;
        }
    }
    return false;
}